

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::UniformCase::writeUniformComparisons
          (UniformCase *this,ostringstream *dst,
          vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,char *variableName)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  BasicUniform *unif;
  int i;
  char *variableName_local;
  vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  ostringstream *dst_local;
  UniformCase *this_local;
  
  unif._4_4_ = 0;
  while( true ) {
    sVar1 = std::
            vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
            ::size(basicUniforms);
    if ((int)sVar1 <= unif._4_4_) break;
    pvVar2 = std::
             vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
             ::operator[](basicUniforms,(long)unif._4_4_);
    if ((pvVar2->isUsedInShader & 1U) == 0) {
      poVar3 = std::operator<<((ostream *)dst,"\t// UNUSED: ");
      pvVar2 = std::
               vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
               ::operator[](basicUniforms,(long)unif._4_4_);
      poVar3 = std::operator<<(poVar3,(string *)pvVar2);
      std::operator<<(poVar3,"\n");
    }
    else {
      poVar3 = std::operator<<((ostream *)dst,"\t");
      poVar3 = std::operator<<(poVar3,variableName);
      std::operator<<(poVar3," *= ");
      pvVar2 = std::
               vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
               ::operator[](basicUniforms,(long)unif._4_4_);
      writeUniformCompareExpr(this,dst,pvVar2);
      std::operator<<((ostream *)dst,";\n");
    }
    unif._4_4_ = unif._4_4_ + 1;
  }
  return;
}

Assistant:

void UniformCase::writeUniformComparisons (std::ostringstream& dst, const vector<BasicUniform>& basicUniforms, const char* const variableName) const
{
	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		const BasicUniform& unif = basicUniforms[i];

		if (unif.isUsedInShader)
		{
			dst << "\t" << variableName << " *= ";
			writeUniformCompareExpr(dst, basicUniforms[i]);
			dst << ";\n";
		}
		else
			dst << "\t// UNUSED: " << basicUniforms[i].name << "\n";
	}
}